

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualsource.cpp
# Opt level: O0

bool QualSource::addSource(Node *node,int t,double b,Pattern *p)

{
  QualSource *this;
  Pattern *p_local;
  double b_local;
  int t_local;
  Node *node_local;
  
  if (node->qualSource == (QualSource *)0x0) {
    this = (QualSource *)operator_new(0x30);
    QualSource(this);
    node->qualSource = this;
    if (node->qualSource == (QualSource *)0x0) {
      return false;
    }
  }
  node->qualSource->type = t;
  node->qualSource->base = b;
  node->qualSource->pattern = p;
  node->qualSource->quality = 0.0;
  node->qualSource->outflow = 0.0;
  return true;
}

Assistant:

bool QualSource::addSource(Node* node, int t, double b, Pattern* p)
{
    if ( node->qualSource == nullptr )
    {
        node->qualSource = new QualSource();
        if ( node->qualSource == nullptr ) return false;
    }
    node->qualSource->type = t;
    node->qualSource->base = b;
    node->qualSource->pattern = p;
    node->qualSource->quality = 0.0;
    node->qualSource->outflow = 0.0;
    return true;
}